

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

double sulp(U *x,BCinfo *bc)

{
  if ((bc->scale != 0) && ((x->L[1] & 0x7ff00000) < 0x6b00000)) {
    return 4.008336720017946e-292;
  }
  if ((x->L[1] == 0) && (x->L[0] == 0)) {
    __assert_fail("word0(x) || word1(x)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/dtoa.c"
                  ,0x549,"double sulp(U *, BCinfo *)");
  }
  return (double)((ulong)((x->L[1] & 0x7ff00000) + 0xfcc00000) << 0x20);
}

Assistant:

static double
sulp(U *x, BCinfo *bc)
{
    U u;

    if (bc->scale && 2*P + 1 > (int)((word0(x) & Exp_mask) >> Exp_shift)) {
        /* rv/2^bc->scale is subnormal */
        word0(&u) = (P+2)*Exp_msk1;
        word1(&u) = 0;
        return u.d;
    }
    else {
        assert(word0(x) || word1(x)); /* x != 0.0 */
        return ulp(x);
    }
}